

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromosome.h
# Opt level: O2

void __thiscall tsp::Chromosome::Chromosome(Chromosome *this,Region *region)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  uint v;
  uint uVar3;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  p_Var1 = &(this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  *(undefined8 *)&(this->region).mapOfCities._M_t._M_impl = 0;
  *(undefined8 *)&(this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->region).mapOfCities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->values,&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  sVar2 = (region->mapOfCities)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (uVar3 = 1; uVar3 <= (uint)sVar2; uVar3 = uVar3 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,uVar3);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->values,(int *)&local_48);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
               *)this,(_Rb_tree<int,_std::pair<const_int,_tsp::City>,_std::_Select1st<std::pair<const_int,_tsp::City>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tsp::City>_>_>
                       *)region);
  return;
}

Assistant:

Chromosome::Chromosome(tsp::Region &region) {
        this->values = std::vector<int>();
        uint size = region.countCities();

        for (uint v = 1; v <= size; v++) {
            this->values.push_back(v);
        }

        this->region = region;
    }